

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O3

PointerType * LLVMBC::PointerType::get(Type *pointee,uint addr_space)

{
  pointer *pppTVar1;
  LLVMContext *this;
  iterator __position;
  pointer ppTVar2;
  PointerType *pPVar3;
  uint in_ESI;
  Type *in_RDI;
  PointerType *pointer_type;
  uint local_24;
  PointerType *local_20;
  Type *local_18;
  
  this = in_RDI->context;
  ppTVar2 = (this->type_cache).
            super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (ppTVar2 ==
        (this->type_cache).
        super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pPVar3 = LLVMContext::construct<LLVMBC::PointerType,LLVMBC::Type*&,unsigned_int&>
                         (this,&local_18,&local_24);
      __position._M_current =
           (this->type_cache).
           super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->type_cache).
          super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        local_20 = pPVar3;
        std::vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>>::
        _M_realloc_insert<LLVMBC::Type*>
                  ((vector<LLVMBC::Type*,dxil_spv::ThreadLocalAllocator<LLVMBC::Type*>> *)
                   &this->type_cache,__position,(Type **)&local_20);
      }
      else {
        *__position._M_current = &pPVar3->super_Type;
        pppTVar1 = &(this->type_cache).
                    super__Vector_base<LLVMBC::Type_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      return pPVar3;
    }
    pPVar3 = (PointerType *)*ppTVar2;
    if ((((pPVar3->super_Type).type_id == PointerTyID) &&
        ((pPVar3->super_Type).address_space == in_ESI)) && (pPVar3->contained_type == in_RDI))
    break;
    ppTVar2 = ppTVar2 + 1;
  }
  return pPVar3;
}

Assistant:

PointerType *PointerType::get(Type *pointee, unsigned addr_space)
{
	auto &context = pointee->getContext();
	auto &cache = context.get_type_cache();
	for (auto *type : cache)
	{
		if (type->getTypeID() == TypeID::PointerTyID)
		{
			auto *pointer_type = cast<PointerType>(type);
			if (pointer_type->getAddressSpace() == addr_space && pointer_type->getElementType() == pointee)
				return pointer_type;
		}
	}

	auto *type = context.construct<PointerType>(pointee, addr_space);
	cache.push_back(type);
	return type;
}